

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableStringFieldGenerator::ImmutableStringFieldGenerator
          (ImmutableStringFieldGenerator *this,FieldDescriptor *descriptor,int messageBitIndex,
          int builderBitIndex,Context *context)

{
  ClassNameResolver *pCVar1;
  _func_int **in_RSI;
  ImmutableFieldGenerator *in_RDI;
  FieldDescriptor *in_stack_00000008;
  Context *in_stack_00000010;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_00000bc0;
  ClassNameResolver *in_stack_00000bc8;
  FieldGeneratorInfo *in_stack_00000bd0;
  int in_stack_00000bd8;
  int in_stack_00000bdc;
  FieldDescriptor *in_stack_00000be0;
  
  ImmutableFieldGenerator::ImmutableFieldGenerator(in_RDI);
  in_RDI->_vptr_ImmutableFieldGenerator = (_func_int **)&PTR__ImmutableStringFieldGenerator_008978a8
  ;
  in_RDI[1]._vptr_ImmutableFieldGenerator = in_RSI;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x59db10);
  pCVar1 = Context::GetNameResolver((Context *)0x59db28);
  in_RDI[8]._vptr_ImmutableFieldGenerator = (_func_int **)pCVar1;
  Context::GetFieldGeneratorInfo(in_stack_00000010,in_stack_00000008);
  anon_unknown_5::SetPrimitiveVariables
            (in_stack_00000be0,in_stack_00000bdc,in_stack_00000bd8,in_stack_00000bd0,
             in_stack_00000bc8,in_stack_00000bc0);
  return;
}

Assistant:

ImmutableStringFieldGenerator::ImmutableStringFieldGenerator(
    const FieldDescriptor* descriptor, int messageBitIndex, int builderBitIndex,
    Context* context)
    : descriptor_(descriptor), name_resolver_(context->GetNameResolver()) {
  SetPrimitiveVariables(descriptor, messageBitIndex, builderBitIndex,
                        context->GetFieldGeneratorInfo(descriptor),
                        name_resolver_, &variables_);
}